

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

int * __thiscall kj::Arena::allocate<int>(Arena *this)

{
  int *piVar1;
  
  piVar1 = (int *)allocateBytes(this,4,4,false);
  return piVar1;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}